

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::XmlReporter::listTests
          (XmlReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
          IConfig *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestCaseInfo *this_00;
  ulong __val;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  XmlFormatting fmt;
  XmlWriter *this_01;
  char cVar5;
  pointer pTVar6;
  string __str;
  ScopedElement sourceTag;
  ScopedElement innerTag;
  ScopedElement outerTag;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  pointer local_68;
  ScopedElement local_60;
  ScopedElement local_50;
  
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"MatchingTests","");
  this_01 = &this->m_xml;
  XmlWriter::scopedElement
            ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_01,(XmlFormatting)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pTVar6 = (tests->super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_68 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar6 != local_68) {
    do {
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"TestCase","");
      fmt = (XmlFormatting)&local_b0;
      XmlWriter::scopedElement((XmlWriter *)&local_50,(string *)this_01,fmt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      this_00 = pTVar6->m_info;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Name","");
      XmlWriter::startElement(this_01,&local_b0,Indent);
      XmlWriter::writeText(this_01,&this_00->name,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ClassName","");
      XmlWriter::startElement(this_01,&local_b0,Indent);
      XmlWriter::writeText(this_01,&this_00->className,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Tags","");
      XmlWriter::startElement(this_01,&local_b0,Indent);
      TestCaseInfo::tagsAsString_abi_cxx11_(&local_88,this_00);
      XmlWriter::writeText(this_01,&local_88,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"SourceInfo","");
      XmlWriter::scopedElement((XmlWriter *)&local_60,(string *)this_01,fmt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"File","");
      XmlWriter::startElement(this_01,&local_b0,Indent);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,(this_00->lineInfo).file,&local_89);
      XmlWriter::writeText(this_01,&local_88,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Line","");
      XmlWriter::startElement(this_01,&local_b0,Indent);
      __val = (this_00->lineInfo).line;
      cVar5 = '\x01';
      if (9 < __val) {
        uVar4 = __val;
        cVar3 = '\x04';
        do {
          cVar5 = cVar3;
          if (uVar4 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_001a32ae;
          }
          if (uVar4 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_001a32ae;
          }
          if (uVar4 < 10000) goto LAB_001a32ae;
          bVar2 = 99999 < uVar4;
          uVar4 = uVar4 / 10000;
          cVar3 = cVar5 + '\x04';
        } while (bVar2);
        cVar5 = cVar5 + '\x01';
      }
LAB_001a32ae:
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_88,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_88._M_dataplus._M_p,(uint)local_88._M_string_length,__val);
      XmlWriter::writeText(this_01,&local_88,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement(&local_60);
      XmlWriter::ScopedElement::~ScopedElement(&local_50);
      pTVar6 = pTVar6 + 1;
    } while (pTVar6 != local_68);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void XmlReporter::listTests(std::vector<TestCaseHandle> const &tests, IConfig const &) {
        auto outerTag = m_xml.scopedElement("MatchingTests");
        for (auto const &test : tests) {
            auto innerTag = m_xml.scopedElement("TestCase");
            auto const &testInfo = test.getTestCaseInfo();
            m_xml.startElement("Name", XmlFormatting::Indent)
                .writeText(testInfo.name, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("ClassName", XmlFormatting::Indent)
                .writeText(testInfo.className, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("Tags", XmlFormatting::Indent)
                .writeText(testInfo.tagsAsString(), XmlFormatting::None)
                .endElement(XmlFormatting::Newline);

            auto sourceTag = m_xml.scopedElement("SourceInfo");
            m_xml.startElement("File", XmlFormatting::Indent)
                .writeText(testInfo.lineInfo.file, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("Line", XmlFormatting::Indent)
                .writeText(std::to_string(testInfo.lineInfo.line), XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
        }
    }